

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if2ip.c
# Opt level: O3

if2ip_result_t
Curl_if2ip(int af,uint remote_scope,uint param_3,char *interf,char *buf,size_t buf_size)

{
  sockaddr *sa;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  if2ip_result_t iVar4;
  long *plVar5;
  ifaddrs *head;
  char scope [12];
  char ipstr [64];
  long *local_98;
  char local_90 [16];
  size_t local_80;
  char local_78 [72];
  
  iVar1 = getifaddrs(&local_98);
  if (iVar1 < 0) {
    iVar4 = IF2IP_NOT_FOUND;
  }
  else {
    if (local_98 == (long *)0x0) {
      iVar4 = IF2IP_NOT_FOUND;
    }
    else {
      iVar4 = IF2IP_NOT_FOUND;
      plVar5 = local_98;
      local_80 = buf_size;
      do {
        if ((ushort *)plVar5[3] != (ushort *)0x0) {
          if ((uint)*(ushort *)plVar5[3] == af) {
            iVar1 = curl_strequal((char *)plVar5[1],interf);
            if (iVar1 != 0) {
              local_90[8] = '\0';
              local_90[9] = '\0';
              local_90[10] = '\0';
              local_90[0xb] = '\0';
              local_90[0] = '\0';
              local_90[1] = '\0';
              local_90[2] = '\0';
              local_90[3] = '\0';
              local_90[4] = '\0';
              local_90[5] = '\0';
              local_90[6] = '\0';
              local_90[7] = '\0';
              sa = (sockaddr *)plVar5[3];
              if (af == 10) {
                uVar2 = Curl_ipv6_scope(sa);
                if ((uVar2 != remote_scope) ||
                   ((param_3 != 0 && (*(uint *)(sa[1].sa_data + 6) != param_3)))) {
                  iVar4 = IF2IP_AF_NOT_SUPPORTED;
                  goto LAB_0013d42e;
                }
                pcVar3 = sa->sa_data + 6;
                if (*(uint *)(sa[1].sa_data + 6) != 0) {
                  curl_msnprintf(local_90,0xc,"%%%u");
                }
              }
              else {
                pcVar3 = sa->sa_data + 2;
              }
              pcVar3 = inet_ntop(af,pcVar3,local_78,0x40);
              curl_msnprintf(buf,local_80,"%s%s",pcVar3,local_90);
              iVar4 = IF2IP_FOUND;
              break;
            }
          }
          else if (iVar4 == IF2IP_NOT_FOUND) {
            iVar1 = curl_strequal((char *)plVar5[1],interf);
            iVar4 = (if2ip_result_t)(iVar1 != 0);
          }
        }
LAB_0013d42e:
        plVar5 = (long *)*plVar5;
      } while (plVar5 != (long *)0x0);
    }
    freeifaddrs(local_98);
  }
  return iVar4;
}

Assistant:

if2ip_result_t Curl_if2ip(int af,
#ifdef USE_IPV6
                          unsigned int remote_scope,
                          unsigned int local_scope_id,
#endif
                          const char *interf,
                          char *buf, size_t buf_size)
{
  struct ifaddrs *iface, *head;
  if2ip_result_t res = IF2IP_NOT_FOUND;

#if defined(USE_IPV6) && \
    !defined(HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID)
  (void) local_scope_id;
#endif

  if(getifaddrs(&head) >= 0) {
    for(iface = head; iface != NULL; iface = iface->ifa_next) {
      if(iface->ifa_addr) {
        if(iface->ifa_addr->sa_family == af) {
          if(strcasecompare(iface->ifa_name, interf)) {
            void *addr;
            const char *ip;
            char scope[12] = "";
            char ipstr[64];
#ifdef USE_IPV6
            if(af == AF_INET6) {
#ifdef HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID
              unsigned int scopeid = 0;
#endif
              unsigned int ifscope = Curl_ipv6_scope(iface->ifa_addr);

              if(ifscope != remote_scope) {
                /* We are interested only in interface addresses whose scope
                   matches the remote address we want to connect to: global
                   for global, link-local for link-local, etc... */
                if(res == IF2IP_NOT_FOUND)
                  res = IF2IP_AF_NOT_SUPPORTED;
                continue;
              }

              addr =
                &((struct sockaddr_in6 *)(void *)iface->ifa_addr)->sin6_addr;
#ifdef HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID
              /* Include the scope of this interface as part of the address */
              scopeid = ((struct sockaddr_in6 *)(void *)iface->ifa_addr)
                            ->sin6_scope_id;

              /* If given, scope id should match. */
              if(local_scope_id && scopeid != local_scope_id) {
                if(res == IF2IP_NOT_FOUND)
                  res = IF2IP_AF_NOT_SUPPORTED;

                continue;
              }

              if(scopeid)
                msnprintf(scope, sizeof(scope), "%%%u", scopeid);
#endif
            }
            else
#endif
              addr =
                &((struct sockaddr_in *)(void *)iface->ifa_addr)->sin_addr;
            res = IF2IP_FOUND;
            ip = curlx_inet_ntop(af, addr, ipstr, sizeof(ipstr));
            msnprintf(buf, buf_size, "%s%s", ip, scope);
            break;
          }
        }
        else if((res == IF2IP_NOT_FOUND) &&
                strcasecompare(iface->ifa_name, interf)) {
          res = IF2IP_AF_NOT_SUPPORTED;
        }
      }
    }

    freeifaddrs(head);
  }

  return res;
}